

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ovf.cpp
# Opt level: O0

ovf_file * ovf_open(char *filename)

{
  ovf_file *ovf_file_ptr_00;
  ovf_file *ovf_file_ptr;
  char *filename_local;
  
  ovf_file_ptr_00 = (ovf_file *)operator_new(0x20);
  ovf_file_initialize(ovf_file_ptr_00,filename);
  return ovf_file_ptr_00;
}

Assistant:

struct ovf_file * ovf_open(const char * filename)
try
{
    // Initialize the struct
    struct ovf_file * ovf_file_ptr = new ovf_file;
    ovf_file_initialize(ovf_file_ptr, filename);
    return ovf_file_ptr;
}
catch( ... )
{
    return nullptr;
}